

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Sector_SetFloorScale2
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  int secnum;
  FSectorTagIterator itr;
  double yscale;
  double xscale;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  yscale = (double)arg1 / 65536.0;
  itr = (FSectorTagIterator)((double)arg2 / 65536.0);
  if ((yscale != 0.0) || (NAN(yscale))) {
    yscale = 1.0 / yscale;
  }
  if (((double)itr != 0.0) || (NAN((double)itr))) {
    itr = (FSectorTagIterator)(1.0 / (double)itr);
  }
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffc0,arg0);
  while (iVar1 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffc0),
        -1 < iVar1) {
    if (arg1 != 0) {
      sector_t::SetXScale(sectors + iVar1,0,yscale);
    }
    if (arg2 != 0) {
      sector_t::SetYScale(sectors + iVar1,0,(double)itr);
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFloorScale2)
// Sector_SetFloorScale2 (tag, x-factor, y-factor)
{
	double xscale = arg1 / 65536., yscale = arg2 / 65536.;

	if (xscale)
		xscale = 1. / xscale;
	if (yscale)
		yscale = 1. / yscale;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (arg1)
			sectors[secnum].SetXScale(sector_t::floor, xscale);
		if (arg2)
			sectors[secnum].SetYScale(sector_t::floor, yscale);
	}
	return true;
}